

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O1

void __thiscall tst_GenericModel::removeRow(tst_GenericModel *this)

{
  uint uVar1;
  long lVar2;
  char cVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  uint *puVar7;
  long lVar8;
  bool bVar9;
  value_type args;
  GenericModel testModel;
  QSignalSpy *spyArr [2];
  ModelTest probe;
  QSignalSpy rowsAboutToBeRemovedSpy;
  QSignalSpy rowsRemovedSpy;
  QArrayDataPointer<QVariant> local_1b8;
  QModelIndex local_1a0;
  QSignalSpy *local_188 [3];
  QModelIndex local_170;
  undefined **local_158 [2];
  QModelIndex local_148;
  QSignalSpy local_130;
  QSignalSpy local_b0;
  
  puVar7 = (uint *)QTest::qData("insertCol",2);
  uVar1 = *puVar7;
  GenericModel::GenericModel((GenericModel *)&local_1a0,(QObject *)0x0);
  QAbstractItemModelTester::QAbstractItemModelTester
            ((QAbstractItemModelTester *)local_158,(QAbstractItemModel *)&local_1a0,QtTest,
             (QObject *)0x0);
  local_158[0] = &PTR_metaObject_001659f8;
  if (0 < (int)uVar1) {
    local_130.super_QObject = (QObject)0xff;
    local_130._1_7_ = 0xffffffffffffff;
    local_130._8_8_ = 0;
    local_130.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
    GenericModel::insertColumns((int)&local_1a0,0,(QModelIndex *)(ulong)uVar1);
  }
  local_130.super_QObject = (QObject)0xff;
  local_130._1_7_ = 0xffffffffffffff;
  local_130._8_8_ = 0;
  local_130.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::insertRows((int)&local_1a0,0,(QModelIndex *)0xd);
  QSignalSpy::QSignalSpy
            (&local_130,(QObject *)&local_1a0,"2rowsAboutToBeRemoved(QModelIndex, int, int)");
  cVar3 = QTest::qVerify(local_130.sig.d.size != 0,"rowsAboutToBeRemovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x1dc);
  if (cVar3 == '\0') goto LAB_0010e44f;
  QSignalSpy::QSignalSpy(&local_b0,(QObject *)&local_1a0,"2rowsRemoved(QModelIndex, int, int)");
  cVar3 = QTest::qVerify(local_b0.sig.d.size != 0,"rowsRemovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x1de);
  if (cVar3 != '\0') {
    local_1b8.d = (Data *)0xffffffffffffffff;
    local_1b8.ptr = (QVariant *)0x0;
    local_1b8.size = 0;
    local_188[0] = &local_130;
    local_188[1] = &local_b0;
    iVar6 = GenericModel::rowCount(&local_1a0);
    cVar3 = QTest::qCompare(iVar6,0xd,"testModel.rowCount()","13",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1e1);
    if (cVar3 != '\0') {
      local_1b8.d = (Data *)0xffffffffffffffff;
      local_1b8.ptr = (QVariant *)0x0;
      local_1b8.size = 0;
      bVar4 = (**(code **)(local_1a0._0_8_ + 0x108))(&local_1a0,0xffffffff,1);
      cVar3 = QTest::qVerify((bool)(bVar4 ^ 1),"!testModel.removeRow(-1)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x1e2);
      if (cVar3 != '\0') {
        local_1b8.d = (Data *)0xffffffffffffffff;
        local_1b8.ptr = (QVariant *)0x0;
        local_1b8.size = 0;
        iVar6 = GenericModel::rowCount(&local_1a0);
        cVar3 = QTest::qCompare(iVar6,0xd,"testModel.rowCount()","13",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x1e3);
        if (cVar3 != '\0') {
          lVar8 = 0;
          do {
            cVar3 = QTest::qCompare(*(longlong *)(*(long *)((long)local_188 + lVar8) + 0x20),0,
                                    "spy->count()","0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x1e5);
            if (cVar3 == '\0') goto LAB_0010e3c8;
            lVar8 = lVar8 + 8;
          } while (lVar8 != 0x10);
          local_1b8.d = (Data *)0xffffffffffffffff;
          local_1b8.ptr = (QVariant *)0x0;
          local_1b8.size = 0;
          bVar4 = (**(code **)(local_1a0._0_8_ + 0x108))(&local_1a0,0xd,1);
          cVar3 = QTest::qVerify((bool)(bVar4 ^ 1),"!testModel.removeRow(13)","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x1e6);
          if (cVar3 != '\0') {
            local_1b8.d = (Data *)0xffffffffffffffff;
            local_1b8.ptr = (QVariant *)0x0;
            local_1b8.size = 0;
            iVar6 = GenericModel::rowCount(&local_1a0);
            cVar3 = QTest::qCompare(iVar6,0xd,"testModel.rowCount()","13",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x1e7);
            if (cVar3 != '\0') {
              lVar8 = 0;
              do {
                cVar3 = QTest::qCompare(*(longlong *)(*(long *)((long)local_188 + lVar8) + 0x20),0,
                                        "spy->count()","0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x1e9);
                if (cVar3 == '\0') goto LAB_0010e3c8;
                lVar8 = lVar8 + 8;
              } while (lVar8 != 0x10);
              local_1b8.d = (Data *)0xffffffffffffffff;
              local_1b8.ptr = (QVariant *)0x0;
              local_1b8.size = 0;
              bVar5 = (bool)(**(code **)(local_1a0._0_8_ + 0x108))(&local_1a0,0,1);
              cVar3 = QTest::qVerify(bVar5,"testModel.removeRow(0)","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x1ea);
              if (cVar3 != '\0') {
                local_1b8.d = (Data *)0xffffffffffffffff;
                local_1b8.ptr = (QVariant *)0x0;
                local_1b8.size = 0;
                iVar6 = GenericModel::rowCount(&local_1a0);
                cVar3 = QTest::qCompare(iVar6,0xc,"testModel.rowCount()","12",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x1eb);
                if (cVar3 != '\0') {
                  lVar8 = 0;
                  do {
                    lVar2 = *(long *)((long)local_188 + lVar8);
                    cVar3 = QTest::qCompare(*(longlong *)(lVar2 + 0x20),1,"spy->count()","1",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x1ed);
                    if (cVar3 == '\0') goto LAB_0010e3c8;
                    QList<QList<QVariant>_>::takeFirst
                              ((value_type *)&local_1b8,(QList<QList<QVariant>_> *)(lVar2 + 0x10));
                    iVar6 = QVariant::toInt((bool *)(local_1b8.ptr + 2));
                    cVar3 = QTest::qCompare(iVar6,0,"args.at(2).toInt()","0",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x1ef);
                    if (cVar3 == '\0') goto LAB_0010e3c0;
                    iVar6 = QVariant::toInt((bool *)(local_1b8.ptr + 1));
                    cVar3 = QTest::qCompare(iVar6,0,"args.at(1).toInt()","0",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x1f0);
                    if (cVar3 == '\0') goto LAB_0010e3c0;
                    QVariant::value<QModelIndex>(&local_148,local_1b8.ptr);
                    local_170.r = -1;
                    local_170.c = -1;
                    local_170.i = 0;
                    local_170.m = (QAbstractItemModel *)0x0;
                    bVar5 = QTest::qCompare<QModelIndex,QModelIndex>
                                      (&local_148,&local_170,"args.at(0).value<QModelIndex>()",
                                       "QModelIndex()",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                       ,0x1f1);
                    QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_1b8);
                    if (!bVar5) goto LAB_0010e3c8;
                    lVar8 = lVar8 + 8;
                  } while (lVar8 != 0x10);
                  local_1b8.d = (Data *)0xffffffffffffffff;
                  local_1b8.ptr = (QVariant *)0x0;
                  local_1b8.size = 0;
                  bVar5 = (bool)(**(code **)(local_1a0._0_8_ + 0x108))(&local_1a0,0,1);
                  cVar3 = QTest::qVerify(bVar5,"testModel.removeRow(0)","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                         ,499);
                  if (cVar3 != '\0') {
                    local_1b8.d = (Data *)0xffffffffffffffff;
                    local_1b8.ptr = (QVariant *)0x0;
                    local_1b8.size = 0;
                    iVar6 = GenericModel::rowCount(&local_1a0);
                    cVar3 = QTest::qCompare(iVar6,0xb,"testModel.rowCount()","11",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,500);
                    if (cVar3 != '\0') {
                      lVar8 = 0;
                      do {
                        lVar2 = *(long *)((long)local_188 + lVar8);
                        cVar3 = QTest::qCompare(*(longlong *)(lVar2 + 0x20),1,"spy->count()","1",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x1f6);
                        if (cVar3 == '\0') goto LAB_0010e3c8;
                        QList<QList<QVariant>_>::takeFirst
                                  ((value_type *)&local_1b8,
                                   (QList<QList<QVariant>_> *)(lVar2 + 0x10));
                        iVar6 = QVariant::toInt((bool *)(local_1b8.ptr + 2));
                        cVar3 = QTest::qCompare(iVar6,0,"args.at(2).toInt()","0",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x1f8);
                        if (cVar3 == '\0') goto LAB_0010e3c0;
                        iVar6 = QVariant::toInt((bool *)(local_1b8.ptr + 1));
                        cVar3 = QTest::qCompare(iVar6,0,"args.at(1).toInt()","0",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x1f9);
                        if (cVar3 == '\0') goto LAB_0010e3c0;
                        QVariant::value<QModelIndex>(&local_148,local_1b8.ptr);
                        local_170.r = -1;
                        local_170.c = -1;
                        local_170.i = 0;
                        local_170.m = (QAbstractItemModel *)0x0;
                        bVar5 = QTest::qCompare<QModelIndex,QModelIndex>
                                          (&local_148,&local_170,"args.at(0).value<QModelIndex>()",
                                           "QModelIndex()",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                           ,0x1fa);
                        QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_1b8);
                        if (!bVar5) goto LAB_0010e3c8;
                        lVar8 = lVar8 + 8;
                      } while (lVar8 != 0x10);
                      local_1b8.d = (Data *)0xffffffffffffffff;
                      local_1b8.ptr = (QVariant *)0x0;
                      local_1b8.size = 0;
                      bVar5 = (bool)(**(code **)(local_1a0._0_8_ + 0x108))(&local_1a0,1,1);
                      cVar3 = QTest::qVerify(bVar5,"testModel.removeRow(1)","",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                             ,0x1fc);
                      if (cVar3 != '\0') {
                        local_1b8.d = (Data *)0xffffffffffffffff;
                        local_1b8.ptr = (QVariant *)0x0;
                        local_1b8.size = 0;
                        iVar6 = GenericModel::rowCount(&local_1a0);
                        cVar3 = QTest::qCompare(iVar6,10,"testModel.rowCount()","10",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x1fd);
                        if (cVar3 != '\0') {
                          lVar8 = 0;
                          do {
                            lVar2 = *(long *)((long)local_188 + lVar8);
                            cVar3 = QTest::qCompare(*(longlong *)(lVar2 + 0x20),1,"spy->count()","1"
                                                    ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1ff);
                            if (cVar3 == '\0') goto LAB_0010e3c8;
                            QList<QList<QVariant>_>::takeFirst
                                      ((value_type *)&local_1b8,
                                       (QList<QList<QVariant>_> *)(lVar2 + 0x10));
                            iVar6 = QVariant::toInt((bool *)(local_1b8.ptr + 2));
                            cVar3 = QTest::qCompare(iVar6,1,"args.at(2).toInt()","1",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x201);
                            if (cVar3 == '\0') goto LAB_0010e3c0;
                            iVar6 = QVariant::toInt((bool *)(local_1b8.ptr + 1));
                            cVar3 = QTest::qCompare(iVar6,1,"args.at(1).toInt()","1",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x202);
                            if (cVar3 == '\0') goto LAB_0010e3c0;
                            QVariant::value<QModelIndex>(&local_148,local_1b8.ptr);
                            local_170.r = -1;
                            local_170.c = -1;
                            local_170.i = 0;
                            local_170.m = (QAbstractItemModel *)0x0;
                            bVar5 = QTest::qCompare<QModelIndex,QModelIndex>
                                              (&local_148,&local_170,
                                               "args.at(0).value<QModelIndex>()","QModelIndex()",
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                               ,0x203);
                            QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_1b8);
                            if (!bVar5) goto LAB_0010e3c8;
                            lVar8 = lVar8 + 8;
                          } while (lVar8 != 0x10);
                          local_1b8.d = (Data *)0xffffffffffffffff;
                          local_1b8.ptr = (QVariant *)0x0;
                          local_1b8.size = 0;
                          bVar5 = (bool)(**(code **)(local_1a0._0_8_ + 0x108))(&local_1a0,9,1);
                          cVar3 = QTest::qVerify(bVar5,"testModel.removeRow(9)","",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                 ,0x205);
                          if (cVar3 != '\0') {
                            local_1b8.d = (Data *)0xffffffffffffffff;
                            local_1b8.ptr = (QVariant *)0x0;
                            local_1b8.size = 0;
                            iVar6 = GenericModel::rowCount(&local_1a0);
                            cVar3 = QTest::qCompare(iVar6,9,"testModel.rowCount()","9",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x206);
                            if (cVar3 != '\0') {
                              lVar8 = 0;
                              do {
                                lVar2 = *(long *)((long)local_188 + lVar8);
                                cVar3 = QTest::qCompare(*(longlong *)(lVar2 + 0x20),1,"spy->count()"
                                                        ,"1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x208);
                                if (cVar3 == '\0') break;
                                QList<QList<QVariant>_>::takeFirst
                                          ((value_type *)&local_1b8,
                                           (QList<QList<QVariant>_> *)(lVar2 + 0x10));
                                iVar6 = QVariant::toInt((bool *)(local_1b8.ptr + 2));
                                cVar3 = QTest::qCompare(iVar6,9,"args.at(2).toInt()","9",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x20a);
                                if (cVar3 == '\0') goto LAB_0010e3c0;
                                iVar6 = QVariant::toInt((bool *)(local_1b8.ptr + 1));
                                cVar3 = QTest::qCompare(iVar6,9,"args.at(1).toInt()","9",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x20b);
                                if (cVar3 == '\0') goto LAB_0010e3c0;
                                QVariant::value<QModelIndex>(&local_148,local_1b8.ptr);
                                local_170.r = -1;
                                local_170.c = -1;
                                local_170.i = 0;
                                local_170.m = (QAbstractItemModel *)0x0;
                                bVar5 = QTest::qCompare<QModelIndex,QModelIndex>
                                                  (&local_148,&local_170,
                                                   "args.at(0).value<QModelIndex>()","QModelIndex()"
                                                   ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x20c);
                                QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_1b8);
                                bVar9 = lVar8 != 8;
                                lVar8 = lVar8 + 8;
                              } while (bVar5 && bVar9);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0010e3c8:
  local_b0._0_8_ = &PTR_metaObject_00165910;
  QObject::~QObject((QObject *)((long)&local_b0 + 0x58));
  if (&(local_b0.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_b0.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_b0 + 0x10));
  QObject::~QObject(&local_b0.super_QObject);
LAB_0010e44f:
  local_130._0_8_ = &PTR_metaObject_00165910;
  QObject::~QObject((QObject *)((long)&local_130 + 0x58));
  if (&(local_130.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_130.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_130.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_130.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_130 + 0x10));
  QObject::~QObject(&local_130.super_QObject);
  QObject::~QObject((QObject *)local_158);
  GenericModel::~GenericModel((GenericModel *)&local_1a0);
  return;
LAB_0010e3c0:
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_1b8);
  goto LAB_0010e3c8;
}

Assistant:

void tst_GenericModel::removeRow()
{
    QFETCH(int, insertCol);
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    if (insertCol > 0)
        testModel.insertColumns(0, insertCol);
    testModel.insertRows(0, 13);
    QSignalSpy rowsAboutToBeRemovedSpy(&testModel, SIGNAL(rowsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(rowsAboutToBeRemovedSpy.isValid());
    QSignalSpy rowsRemovedSpy(&testModel, SIGNAL(rowsRemoved(QModelIndex, int, int)));
    QVERIFY(rowsRemovedSpy.isValid());
    QSignalSpy *const spyArr[] = {&rowsAboutToBeRemovedSpy, &rowsRemovedSpy};

    QCOMPARE(testModel.rowCount(), 13);
    QVERIFY(!testModel.removeRow(-1));
    QCOMPARE(testModel.rowCount(), 13);
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.removeRow(13));
    QCOMPARE(testModel.rowCount(), 13);
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(testModel.removeRow(0));
    QCOMPARE(testModel.rowCount(), 12);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 0);
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
    QVERIFY(testModel.removeRow(0));
    QCOMPARE(testModel.rowCount(), 11);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 0);
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
    QVERIFY(testModel.removeRow(1));
    QCOMPARE(testModel.rowCount(), 10);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 1);
        QCOMPARE(args.at(1).toInt(), 1);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
    QVERIFY(testModel.removeRow(9));
    QCOMPARE(testModel.rowCount(), 9);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 9);
        QCOMPARE(args.at(1).toInt(), 9);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
}